

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O0

int __thiscall zmq::socket_base_t::term_endpoint(socket_base_t *this,char *endpoint_uri_)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  pointer ppVar4;
  inprocs_t *in_RSI;
  long in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
  pVar5;
  iterator it;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
  range;
  string resolved_endpoint_uri;
  string endpoint_uri_str;
  string uri_path;
  string uri_protocol;
  int rc;
  scoped_optional_lock_t sync_lock;
  own_t *in_stack_fffffffffffffe68;
  own_t *in_stack_fffffffffffffe70;
  socket_base_t *in_stack_fffffffffffffe78;
  int local_164;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 uVar6;
  inprocs_t *piVar7;
  pipe_t *this_00;
  char *in_stack_fffffffffffffee8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>
  in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  _Self in_stack_ffffffffffffff00;
  _Self in_stack_ffffffffffffff08;
  _Self in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  byte bVar8;
  string local_e0 [32];
  string local_c0 [39];
  undefined1 local_99 [33];
  string local_78 [32];
  string local_58 [48];
  int local_28;
  undefined4 local_24;
  inprocs_t *local_18;
  int local_4;
  
  local_18 = in_RSI;
  scoped_optional_lock_t::scoped_optional_lock_t
            ((scoped_optional_lock_t *)in_stack_fffffffffffffe70,
             (mutex_t *)in_stack_fffffffffffffe68);
  if ((*(byte *)(in_RDI + 0x61c) & 1) == 0) {
    if (local_18 == (inprocs_t *)0x0) {
      piVar3 = __errno_location();
      *piVar3 = 0x16;
      local_4 = -1;
      local_24 = 1;
    }
    else {
      local_28 = process_commands((socket_base_t *)in_stack_ffffffffffffff00._M_node,
                                  in_stack_fffffffffffffefc,
                                  SUB41((uint)in_stack_fffffffffffffef8 >> 0x18,0));
      if (local_28 == 0) {
        std::__cxx11::string::string(local_58);
        std::__cxx11::string::string(local_78);
        iVar2 = parse_uri((char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                          (string *)in_stack_ffffffffffffff10._M_node,
                          (string *)in_stack_ffffffffffffff08._M_node);
        if ((iVar2 == 0) &&
           (iVar2 = check_protocol(in_stack_fffffffffffffe78,(string *)in_stack_fffffffffffffe70),
           iVar2 == 0)) {
          this_00 = (pipe_t *)local_99;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     (char *)local_18,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          std::allocator<char>::~allocator((allocator<char> *)local_99);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68);
          uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffea4);
          if (bVar1) {
            iVar2 = object_t::unregister_endpoint
                              (&in_stack_fffffffffffffe70->super_object_t,
                               (string *)in_stack_fffffffffffffe68,(socket_base_t *)0x2d3d85);
            if (iVar2 == 0) {
              local_164 = 0;
            }
            else {
              local_164 = inprocs_t::erase_pipes(local_18,(string *)CONCAT44(uVar6,iVar2));
            }
            local_4 = local_164;
            local_24 = 1;
          }
          else {
            bVar8 = 0;
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68);
            if (bVar1) {
              std::__cxx11::string::string(local_e0,(string *)(local_99 + 1));
              bVar8 = 1;
              std::__cxx11::string::c_str();
              resolve_tcp_addr((socket_base_t *)
                               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                               (string *)in_stack_fffffffffffffef0._M_node,in_stack_fffffffffffffee8
                              );
              piVar7 = local_18;
            }
            else {
              std::__cxx11::string::string(local_c0,(string *)(local_99 + 1));
              piVar7 = local_18;
            }
            if ((bVar8 & 1) != 0) {
              std::__cxx11::string::~string(local_e0);
            }
            pVar5 = std::
                    multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
                    ::equal_range((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
                                   *)in_stack_fffffffffffffe70,(key_type *)in_stack_fffffffffffffe68
                                 );
            bVar1 = std::operator==((_Self *)&stack0xffffffffffffff08,
                                    (_Self *)&stack0xffffffffffffff10);
            if (bVar1) {
              piVar3 = __errno_location();
              *piVar3 = 2;
              local_4 = -1;
            }
            else {
              while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff00,
                                             (_Self *)&stack0xffffffffffffff10), bVar1) {
                ppVar4 = std::
                         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>
                         ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>
                                       *)0x2d3fe2);
                if ((ppVar4->second).second != (pipe_t *)0x0) {
                  std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>
                  ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>
                                *)0x2d3ff6);
                  pipe_t::terminate(this_00,SUB81((ulong)piVar7 >> 0x38,0));
                }
                std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>
                ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>
                              *)0x2d4012);
                own_t::term_child(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
                std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>
                ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>
                              *)in_stack_fffffffffffffe70);
              }
              in_stack_fffffffffffffe70 = (own_t *)(in_RDI + 0x5b8);
              std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>
              ::_Rb_tree_const_iterator
                        ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>
                          *)&stack0xfffffffffffffef8,(iterator *)&stack0xffffffffffffff08);
              std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>
              ::_Rb_tree_const_iterator
                        ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>
                          *)&stack0xfffffffffffffef0,(iterator *)&stack0xffffffffffffff10);
              std::
              multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
              ::erase((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
                       *)in_stack_fffffffffffffe78,(_Base_ptr)pVar5.first._M_node,
                      (_Base_ptr)pVar5.second._M_node);
              if ((*(uint *)(in_RDI + 0x15c) & 3) != 0) {
                *(undefined1 *)(in_RDI + 0x6e0) = 1;
              }
              local_4 = 0;
            }
            local_24 = 1;
            std::__cxx11::string::~string(local_c0);
          }
          std::__cxx11::string::~string((string *)(local_99 + 1));
        }
        else {
          local_4 = -1;
          local_24 = 1;
        }
        std::__cxx11::string::~string(local_78);
        std::__cxx11::string::~string(local_58);
      }
      else {
        local_4 = -1;
        local_24 = 1;
      }
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x9523dfd;
    local_4 = -1;
    local_24 = 1;
  }
  scoped_optional_lock_t::~scoped_optional_lock_t
            ((scoped_optional_lock_t *)in_stack_fffffffffffffe70);
  return local_4;
}

Assistant:

int zmq::socket_base_t::term_endpoint (const char *endpoint_uri_)
{
    scoped_optional_lock_t sync_lock (_thread_safe ? &_sync : NULL);

    //  Check whether the context hasn't been shut down yet.
    if (unlikely (_ctx_terminated)) {
        errno = ETERM;
        return -1;
    }

    //  Check whether endpoint address passed to the function is valid.
    if (unlikely (!endpoint_uri_)) {
        errno = EINVAL;
        return -1;
    }

    //  Process pending commands, if any, since there could be pending unprocessed process_own()'s
    //  (from launch_child() for example) we're asked to terminate now.
    const int rc = process_commands (0, false);
    if (unlikely (rc != 0)) {
        return -1;
    }

    //  Parse endpoint_uri_ string.
    std::string uri_protocol;
    std::string uri_path;
    if (parse_uri (endpoint_uri_, uri_protocol, uri_path)
        || check_protocol (uri_protocol)) {
        return -1;
    }

    const std::string endpoint_uri_str = std::string (endpoint_uri_);

    // Disconnect an inproc socket
    if (uri_protocol == protocol_name::inproc) {
        return unregister_endpoint (endpoint_uri_str, this) == 0
                 ? 0
                 : _inprocs.erase_pipes (endpoint_uri_str);
    }

    const std::string resolved_endpoint_uri =
      uri_protocol == protocol_name::tcp
        ? resolve_tcp_addr (endpoint_uri_str, uri_path.c_str ())
        : endpoint_uri_str;

    //  Find the endpoints range (if any) corresponding to the endpoint_uri_pair_ string.
    const std::pair<endpoints_t::iterator, endpoints_t::iterator> range =
      _endpoints.equal_range (resolved_endpoint_uri);
    if (range.first == range.second) {
        errno = ENOENT;
        return -1;
    }

    for (endpoints_t::iterator it = range.first; it != range.second; ++it) {
        //  If we have an associated pipe, terminate it.
        if (it->second.second != NULL)
            it->second.second->terminate (false);
        term_child (it->second.first);
    }
    _endpoints.erase (range.first, range.second);

    if (options.reconnect_stop & ZMQ_RECONNECT_STOP_AFTER_DISCONNECT) {
        _disconnected = true;
    }

    return 0;
}